

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O1

void PrintJSONString(string *in)

{
  string out;
  string local_28;
  
  EncodeJSONString(&local_28,in);
  fwrite(local_28._M_dataplus._M_p,1,local_28._M_string_length,_stdout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PrintJSONString(const std::string& in) {
  std::string out = EncodeJSONString(in);
  fwrite(out.c_str(), 1, out.length(), stdout);
}